

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O2

int checkivError(GLuint object,GLenum pname,PFNGLGETPROGRAMIVPROC glGetiv,
                PFNGLGETPROGRAMINFOLOGPROC glGetInfoLog)

{
  GLint in_EAX;
  GLchar *__ptr;
  char *fmt;
  int iVar1;
  GLint logsize;
  GLint compile_status;
  
  compile_status = 1;
  logsize = in_EAX;
  (*glGetiv)(object,pname,&compile_status);
  iVar1 = 0;
  if (compile_status != 1) {
    (*glGetiv)(object,0x8b84,&logsize);
    __ptr = (GLchar *)malloc((long)logsize + 1);
    if (__ptr == (GLchar *)0x0) {
      bov_error_log(0x30001,"Memory allocation failed");
      fprintf(_stderr,"\t(in function %s, line %d)\n","checkivError",0x7d);
      exit(1);
    }
    (*glGetInfoLog)(object,logsize,&logsize,__ptr);
    fmt = "%s\t-> compile operation failed";
    if (pname == 0x8b82) {
      fmt = "%s\t-> link operation failed";
    }
    iVar1 = 0x20002;
    bov_error_log(0x20002,fmt,__ptr);
    fprintf(_stderr,"\t(in function %s, line %d)\n","checkivError",
            (ulong)((uint)(pname != 0x8b82) * 4 + 0x83));
    free(__ptr);
  }
  return iVar1;
}

Assistant:

static int checkivError(GLuint object, GLenum pname,
                        PFNGLGETPROGRAMIVPROC glGetiv,
                        PFNGLGETPROGRAMINFOLOGPROC glGetInfoLog)
{
	GLint compile_status = GL_TRUE;
	glGetiv(object, pname, &compile_status);
	if(compile_status!=GL_TRUE)
	{
		GLint logsize;
		glGetiv(object, GL_INFO_LOG_LENGTH, &logsize);

		char *log = malloc((size_t) logsize + 1);
		CHECK_MALLOC(log);

		glGetInfoLog(object, logsize, &logsize, log);
		if(pname==GL_LINK_STATUS)
			BOV_ERROR_LOG(BOV_SHADER_ERROR,
			              "%s\t-> link operation failed",
			              log);
		else if(pname==GL_COMPILE_STATUS)
			BOV_ERROR_LOG(BOV_SHADER_ERROR,
			              "%s\t-> compile operation failed",
			              log);
		else
			BOV_ERROR_LOG(BOV_SHADER_ERROR,
			              "%s\t-> Unknown object operation failed",
			              log);
		free(log);
		return BOV_SHADER_ERROR;
	}
	return 0;
}